

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::StructUnionMemberSyntax::StructUnionMemberSyntax
          (StructUnionMemberSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token randomQualifier,
          DataTypeSyntax *type,SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *declarators,
          Token semi)

{
  pointer ppAVar1;
  size_type sVar2;
  SyntaxKind SVar3;
  undefined4 uVar4;
  DataTypeSyntax *pDVar5;
  DeclaratorSyntax *pDVar6;
  undefined8 uVar7;
  long lVar8;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *__range2;
  iterator_base<slang::syntax::DeclaratorSyntax_*> local_30;
  
  uVar7 = randomQualifier._0_8_;
  (this->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (this->super_SyntaxNode).kind = StructUnionMember;
  SVar3 = (attributes->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(attributes->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->attributes).super_SyntaxListBase.super_SyntaxNode.parent =
       (attributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->attributes).super_SyntaxListBase.super_SyntaxNode.kind = SVar3;
  *(undefined4 *)&(this->attributes).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar4;
  (this->attributes).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_0046ff68;
  (this->attributes).super_SyntaxListBase.childCount = (attributes->super_SyntaxListBase).childCount
  ;
  sVar2 = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          .size_;
  (this->attributes).super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
  data_ = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          .data_;
  (this->attributes).super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
  size_ = sVar2;
  (this->attributes).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_004703a8;
  (this->randomQualifier).kind = (short)uVar7;
  (this->randomQualifier).field_0x2 = (char)((ulong)uVar7 >> 0x10);
  (this->randomQualifier).numFlags = (NumericTokenFlags)(char)((ulong)uVar7 >> 0x18);
  (this->randomQualifier).rawLen = (int)((ulong)uVar7 >> 0x20);
  (this->randomQualifier).info = randomQualifier.info;
  local_30.list = (ParentList *)type;
  not_null<slang::syntax::DataTypeSyntax*>::not_null<slang::syntax::DataTypeSyntax*,void>
            ((not_null<slang::syntax::DataTypeSyntax*> *)&this->type,(DataTypeSyntax **)&local_30);
  SVar3 = (declarators->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(declarators->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.parent =
       (declarators->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.kind = SVar3;
  *(undefined4 *)&(this->declarators).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar4;
  (this->declarators).super_SyntaxListBase.childCount =
       (declarators->super_SyntaxListBase).childCount;
  (this->declarators).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00473390;
  sVar2 = (declarators->elements).size_;
  (this->declarators).elements.data_ = (declarators->elements).data_;
  (this->declarators).elements.size_ = sVar2;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  (this->attributes).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  ppAVar1 = (this->attributes).
            super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
  sVar2 = (this->attributes).
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  for (lVar8 = 0; sVar2 << 3 != lVar8; lVar8 = lVar8 + 8) {
    **(undefined8 **)((long)ppAVar1 + lVar8) = this;
  }
  pDVar5 = not_null<slang::syntax::DataTypeSyntax_*>::get(&this->type);
  (pDVar5->super_ExpressionSyntax).super_SyntaxNode.parent = &this->super_SyntaxNode;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  local_30.index = 0;
  sVar2 = (this->declarators).elements.size_;
  local_30.list = &this->declarators;
  for (; (local_30.list != &this->declarators || (local_30.index != sVar2 + 1 >> 1));
      local_30.index = local_30.index + 1) {
    pDVar6 = SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::
             iterator_base<slang::syntax::DeclaratorSyntax_*>::operator*(&local_30);
    (pDVar6->super_SyntaxNode).parent = &this->super_SyntaxNode;
  }
  return;
}

Assistant:

StructUnionMemberSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token randomQualifier, DataTypeSyntax& type, const SeparatedSyntaxList<DeclaratorSyntax>& declarators, Token semi) :
        SyntaxNode(SyntaxKind::StructUnionMember), attributes(attributes), randomQualifier(randomQualifier), type(&type), declarators(declarators), semi(semi) {
        this->attributes.parent = this;
        for (auto child : this->attributes)
            child->parent = this;
        this->type->parent = this;
        this->declarators.parent = this;
        for (auto child : this->declarators)
            child->parent = this;
    }